

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodOptions::SerializeWithCachedSizes
          (MethodOptions *this,CodedOutputStream *output)

{
  bool value;
  MethodOptions_IdempotencyLevel value_00;
  uint uVar1;
  UninterpretedOption *value_01;
  UnknownFieldSet *unknown_fields;
  uint local_40;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  MethodOptions *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    value = deprecated(this);
    internal::WireFormatLite::WriteBool(0x21,value,output);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = idempotency_level(this);
    internal::WireFormatLite::WriteEnum(0x22,value_00,output);
  }
  local_40 = 0;
  uVar1 = uninterpreted_option_size(this);
  for (; local_40 < uVar1; local_40 = local_40 + 1) {
    value_01 = uninterpreted_option(this,local_40);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value_01,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MethodOptions::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void MethodOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.MethodOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(33, this->deprecated(), output);
  }

  // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      34, this->idempotency_level(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.MethodOptions)
}